

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O2

void __thiscall
modified::modified(modified *this,vector<int,_std::allocator<int>_> *_removed,
                  vector<int,_std::allocator<int>_> *_vs,branch_and_reduce_algorithm *_pAlg)

{
  this->_vptr_modified = (_func_int **)&PTR__modified_00128b98;
  this->add = 0;
  (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oldAdj).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldAdj).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldAdj).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pAlg = _pAlg;
  this->foldingMapAdd = -1;
  std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->removed,(_Vector_impl_data *)_removed);
  std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->vs,(_Vector_impl_data *)_vs);
  return;
}

Assistant:

modified::modified(std::vector<int> &_removed, std::vector<int> &_vs, branch_and_reduce_algorithm *_pAlg)
: add(0)
, pAlg(_pAlg)
{
    removed.swap(_removed);
    vs.swap(_vs);
}